

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReverseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  undefined1 *puVar5;
  LogMessage *other;
  long *plVar6;
  size_type *psVar7;
  Result *_result;
  string err;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  LogMessage local_60;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar4) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar4) {
          if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
            if (layer->_oneof_case_[0] == 0x3c0) {
              puVar5 = *(undefined1 **)&layer->layer_;
            }
            else {
              puVar5 = Specification::_ReverseLayerParams_default_instance_;
            }
            iVar2 = (((ConvolutionLayerParams *)puVar5)->kernelsize_).current_size_;
            if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_60,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                         ,0x358);
              other = google::protobuf::internal::LogMessage::operator<<
                                (&local_60,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,other);
              google::protobuf::internal::LogMessage::~LogMessage(&local_60);
            }
            if (iVar2 != *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                        elements[0] + 0x24)) {
              std::operator+(&local_80,"Invalid size of reverse_dim for \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_a0.field_2._M_allocated_capacity = *psVar7;
                local_a0.field_2._8_8_ = plVar6[3];
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              }
              else {
                local_a0.field_2._M_allocated_capacity = *psVar7;
                local_a0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_a0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
                return __return_storage_ptr__;
              }
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
              return __return_storage_ptr__;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReverseLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.reverse();
    // requires len(reverseDim) == rank(inputTensor)
    if (layer.inputtensor_size() > 0) {
        if (params.reversedim_size() != static_cast<int>(layer.inputtensor(0).rank())) {
            const std::string err = "Invalid size of reverse_dim for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}